

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpControl.h
# Opt level: O3

int KeepAlivegpControl(GPCONTROL *pgpControl)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *body;
  char *title;
  int BytesReceived;
  char streamingstatustmp [256];
  char *local_150;
  char *local_148;
  int local_13c;
  sockaddr local_138;
  char local_128 [256];
  
  local_148 = (char *)0x0;
  local_150 = (char *)0x0;
  local_13c = 0;
  local_138.sa_data[6] = '\0';
  local_138.sa_data[7] = '\0';
  local_138.sa_data[8] = '\0';
  local_138.sa_data[9] = '\0';
  local_138.sa_data[10] = '\0';
  local_138.sa_data[0xb] = '\0';
  local_138.sa_data[0xc] = '\0';
  local_138.sa_data[0xd] = '\0';
  local_138.sa_family = 2;
  iVar1 = atoi((pgpControl->RS232Port).port);
  local_138.sa_data._0_2_ = (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
  pcVar2 = (pgpControl->RS232Port).address;
  local_138.sa_data._2_4_ = inet_addr(pcVar2);
  sendto((pgpControl->RS232Port).s,"_GPHD_:0:0:2:0.000000",0x16,0,&local_138,0x10);
  if (pgpControl->bDisableStatusCheck != 0) {
    return 0;
  }
  if ((pgpControl->bDisableHTTPPersistent == 0) ||
     (iVar1 = inittcpcli(&pgpControl->tcpsock,pcVar2,"80"), iVar1 == 0)) {
    iVar1 = sendsimplehttpgetreq(pgpControl->tcpsock,pgpControl->statushttpreq);
    if ((iVar1 != 0) ||
       (iVar1 = recvsimplehtml(pgpControl->tcpsock,&local_148,&local_150,0x100,&local_13c),
       iVar1 != 0)) {
      puts("Error communicating with a gpControl.");
      if (pgpControl->bDisableHTTPPersistent == 0) {
        return 1;
      }
      iVar1 = pgpControl->tcpsock;
      shutdown(iVar1,2);
      close(iVar1);
      return 1;
    }
    if (pgpControl->bDisableHTTPPersistent != 0) {
      iVar1 = pgpControl->tcpsock;
      shutdown(iVar1,2);
      iVar1 = close(iVar1);
      if (iVar1 != 0) goto LAB_00166b82;
    }
    sprintf(local_128,"\"%d\":",(ulong)(uint)pgpControl->streamingstatusid);
    pcVar2 = strstr(local_150,local_128);
    if ((pcVar2 != (char *)0x0) && (sVar3 = strlen(local_128), pcVar2[sVar3] == '1')) {
      free(local_148);
      free(local_150);
      return 0;
    }
    puts("Error communicating with a gpControl.");
    free(local_148);
    free(local_150);
  }
  else {
LAB_00166b82:
    puts("Error communicating with a gpControl.");
  }
  return 1;
}

Assistant:

inline int KeepAlivegpControl(GPCONTROL* pgpControl)
{
	char* ptr = NULL;
	char* title = NULL;
	char* body = NULL;
	int BytesReceived = 0;
	char streamingstatustmp[256];
	struct sockaddr_in sa;
	int salen = sizeof(sa);
	

	memset(&sa, 0, sizeof(sa));
	sa.sin_family = AF_INET;
	sa.sin_port = htons((unsigned short)atoi(pgpControl->RS232Port.port));
	sa.sin_addr.s_addr = inet_addr(pgpControl->RS232Port.address);
	
	// Keep-alive...
	sendto(pgpControl->RS232Port.s, "_GPHD_:0:0:2:0.000000", sizeof("_GPHD_:0:0:2:0.000000"), 0, (struct sockaddr*)&sa, salen);
	

	if (!pgpControl->bDisableStatusCheck)
	{
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (inittcpcli(&pgpControl->tcpsock, pgpControl->RS232Port.address, "80") != EXIT_SUCCESS)
			{
				printf("Error communicating with a gpControl.\n");
				return EXIT_FAILURE;
			}
		}
		if (sendsimplehttpgetreq(pgpControl->tcpsock, pgpControl->statushttpreq) != EXIT_SUCCESS)
		{
			printf("Error communicating with a gpControl.\n");
			if (pgpControl->bDisableHTTPPersistent) releasetcpcli(pgpControl->tcpsock);
			return EXIT_FAILURE;
		}
		if (recvsimplehtml(pgpControl->tcpsock, &title, &body, MAX_NB_BYTES_GPCONTROL, &BytesReceived) != EXIT_SUCCESS)
		{
			printf("Error communicating with a gpControl.\n");
			if (pgpControl->bDisableHTTPPersistent) releasetcpcli(pgpControl->tcpsock);
			return EXIT_FAILURE;
		}
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (releasetcpcli(pgpControl->tcpsock) != EXIT_SUCCESS)
			{
				printf("Error communicating with a gpControl.\n");
				return EXIT_FAILURE;
			}
		}
		sprintf(streamingstatustmp, "\"%d\":", pgpControl->streamingstatusid);
		ptr = strstr(body, streamingstatustmp);
		if ((ptr == NULL)||(ptr[strlen(streamingstatustmp)] != '1'))
		{
			printf("Error communicating with a gpControl.\n");
			free(title);
			free(body);
			return EXIT_FAILURE;
		}
		free(title);
		free(body);
	}

	return EXIT_SUCCESS;
}